

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Thread.cc
# Opt level: O1

void __thiscall tt::Thread::Thread(Thread *this,ThreadFunc *func,string *name)

{
  pointer pcVar1;
  
  this->m_started = false;
  this->m_joined = false;
  this->m_pthreadId = 0;
  this->m_tid = 0;
  std::function<void_()>::function(&this->m_func,func);
  (this->m_name)._M_dataplus._M_p = (pointer)&(this->m_name).field_2;
  pcVar1 = (name->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->m_name,pcVar1,pcVar1 + name->_M_string_length);
  CountDownLatch::CountDownLatch(&this->m_latch,1);
  setDefaultName(this);
  return;
}

Assistant:

Thread::Thread(ThreadFunc func,const std::string& name)
		:m_started(false),
		m_joined(false),
		m_pthreadId(0),
		m_tid(0),
		m_func(func),
		m_name(name),
		m_latch(1){

		setDefaultName();
}